

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SingularFieldHelper<17>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  
  uVar2 = md->tag;
  pbVar5 = output->ptr;
  if (uVar2 < 0x80) {
    *pbVar5 = (byte)uVar2;
    pbVar5 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar2 | 0x80;
    if (uVar2 < 0x4000) {
      pbVar5[1] = (byte)(uVar2 >> 7);
      pbVar5 = pbVar5 + 2;
    }
    else {
      pbVar5 = pbVar5 + 2;
      uVar2 = uVar2 >> 7;
      do {
        pbVar6 = pbVar5;
        pbVar6[-1] = (byte)uVar2 | 0x80;
        uVar3 = uVar2 >> 7;
        pbVar5 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar2;
        uVar2 = uVar3;
      } while (bVar1);
      *pbVar6 = (byte)uVar3;
    }
  }
  output->ptr = pbVar5;
  puVar4 = PrimitiveTypeHelper<17>::SerializeToArray(field,pbVar5);
  output->ptr = puVar4;
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeTo<type>(field, output);
  }